

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMultiBodyDynamicsWorld.cpp
# Opt level: O0

void __thiscall
btMultiBodyDynamicsWorld::integrateTransforms(btMultiBodyDynamicsWorld *this,btScalar timeStep)

{
  undefined1 uVar1;
  int iVar2;
  int iVar3;
  btMultiBody **ppbVar4;
  btMultiBodyLinkCollider *pbVar5;
  btCollisionObject *this_00;
  btMultibodyLink *pbVar6;
  long in_RDI;
  undefined4 in_XMM0_Da;
  btMultiBody *unaff_retaddr;
  btAlignedObjectArray<btVector3> *in_stack_00000090;
  btAlignedObjectArray<btQuaternion> *in_stack_00000098;
  btScalar *pRealBuf;
  int nLinks;
  int b_1;
  bool isSleeping;
  btMultiBody *bod;
  int b;
  btAlignedObjectArray<btVector3> local_origin;
  btAlignedObjectArray<btQuaternion> world_to_local;
  CProfileSample __profile;
  btScalar in_stack_0000036c;
  btDiscreteDynamicsWorld *in_stack_00000370;
  undefined4 in_stack_fffffffffffffed8;
  int in_stack_fffffffffffffedc;
  int in_stack_fffffffffffffee0;
  int in_stack_fffffffffffffee4;
  int in_stack_fffffffffffffef0;
  int in_stack_fffffffffffffef4;
  btScalar *in_stack_fffffffffffffef8;
  undefined7 in_stack_ffffffffffffff00;
  btVector3 local_a8 [2];
  btScalar *local_88;
  int local_7c;
  int local_78;
  byte local_71;
  btMultiBody *local_70;
  int local_64;
  btScalar *in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff0;
  long lVar7;
  
  lVar7 = in_RDI;
  btDiscreteDynamicsWorld::integrateTransforms(in_stack_00000370,in_stack_0000036c);
  CProfileSample::CProfileSample
            ((CProfileSample *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
             (char *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  btAlignedObjectArray<btQuaternion>::btAlignedObjectArray
            ((btAlignedObjectArray<btQuaternion> *)
             CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
  btAlignedObjectArray<btVector3>::btAlignedObjectArray
            ((btAlignedObjectArray<btVector3> *)
             CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
  local_64 = 0;
  while( true ) {
    iVar3 = local_64;
    iVar2 = btAlignedObjectArray<btMultiBody_*>::size
                      ((btAlignedObjectArray<btMultiBody_*> *)(in_RDI + 0x1c8));
    if (iVar2 <= iVar3) break;
    ppbVar4 = btAlignedObjectArray<btMultiBody_*>::operator[]
                        ((btAlignedObjectArray<btMultiBody_*> *)(in_RDI + 0x1c8),local_64);
    local_70 = *ppbVar4;
    local_71 = 0;
    pbVar5 = btMultiBody::getBaseCollider(local_70);
    if (pbVar5 != (btMultiBodyLinkCollider *)0x0) {
      this_00 = (btCollisionObject *)btMultiBody::getBaseCollider(local_70);
      iVar3 = btCollisionObject::getActivationState(this_00);
      if (iVar3 == 2) {
        local_71 = 1;
      }
    }
    local_78 = 0;
    while( true ) {
      iVar3 = local_78;
      iVar2 = btMultiBody::getNumLinks((btMultiBody *)0x24fcae);
      if (iVar2 <= iVar3) break;
      pbVar6 = btMultiBody::getLink
                         ((btMultiBody *)
                          CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                          in_stack_fffffffffffffedc);
      if (pbVar6->m_collider != (btMultiBodyLinkCollider *)0x0) {
        pbVar6 = btMultiBody::getLink
                           ((btMultiBody *)
                            CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                            in_stack_fffffffffffffedc);
        iVar3 = btCollisionObject::getActivationState((btCollisionObject *)pbVar6->m_collider);
        if (iVar3 == 2) {
          local_71 = 1;
        }
      }
      local_78 = local_78 + 1;
    }
    if ((local_71 & 1) == 0) {
      local_7c = btMultiBody::getNumLinks((btMultiBody *)0x24fd64);
      uVar1 = btMultiBody::isPosUpdated(local_70);
      if ((bool)uVar1) {
        in_stack_fffffffffffffef8 = btMultiBody::getVelocityVector((btMultiBody *)0x24fdc3);
        local_88 = in_stack_fffffffffffffef8;
        in_stack_fffffffffffffef4 = btMultiBody::getNumDofs(local_70);
        iVar3 = in_stack_fffffffffffffef4 + 6;
        in_stack_fffffffffffffef0 = btMultiBody::getNumDofs(local_70);
        iVar2 = btMultiBody::getNumDofs(local_70);
        local_88 = local_88 + (iVar3 + in_stack_fffffffffffffef0 * iVar2);
        btMultiBody::stepPositionsMultiDof
                  (unaff_retaddr,(btScalar)((ulong)lVar7 >> 0x20),
                   (btScalar *)CONCAT44(in_XMM0_Da,in_stack_fffffffffffffff0),
                   in_stack_ffffffffffffffe8);
        btMultiBody::setPosUpdated(local_70,false);
      }
      else {
        btMultiBody::stepPositionsMultiDof
                  (unaff_retaddr,(btScalar)((ulong)lVar7 >> 0x20),
                   (btScalar *)CONCAT44(in_XMM0_Da,in_stack_fffffffffffffff0),
                   in_stack_ffffffffffffffe8);
      }
      in_stack_fffffffffffffee4 = local_7c + 1;
      btQuaternion::btQuaternion((btQuaternion *)0x24fe93);
      btAlignedObjectArray<btQuaternion>::resize
                ((btAlignedObjectArray<btQuaternion> *)CONCAT17(uVar1,in_stack_ffffffffffffff00),
                 (int)((ulong)in_stack_fffffffffffffef8 >> 0x20),
                 (btQuaternion *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
      in_stack_fffffffffffffee0 = local_7c + 1;
      btVector3::btVector3(local_a8);
      btAlignedObjectArray<btVector3>::resize
                ((btAlignedObjectArray<btVector3> *)CONCAT17(uVar1,in_stack_ffffffffffffff00),
                 (int)((ulong)in_stack_fffffffffffffef8 >> 0x20),
                 (btVector3 *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
      btMultiBody::updateCollisionObjectWorldTransforms
                ((btMultiBody *)pRealBuf,in_stack_00000098,in_stack_00000090);
    }
    else {
      btMultiBody::clearVelocities
                ((btMultiBody *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
    }
    local_64 = local_64 + 1;
  }
  btAlignedObjectArray<btVector3>::~btAlignedObjectArray
            ((btAlignedObjectArray<btVector3> *)0x24ff3e);
  btAlignedObjectArray<btQuaternion>::~btAlignedObjectArray
            ((btAlignedObjectArray<btQuaternion> *)0x24ff4b);
  CProfileSample::~CProfileSample((CProfileSample *)0x24ff58);
  return;
}

Assistant:

void	btMultiBodyDynamicsWorld::integrateTransforms(btScalar timeStep)
{
	btDiscreteDynamicsWorld::integrateTransforms(timeStep);

	{
		BT_PROFILE("btMultiBody stepPositions");
		//integrate and update the Featherstone hierarchies
		btAlignedObjectArray<btQuaternion> world_to_local;
		btAlignedObjectArray<btVector3> local_origin;

		for (int b=0;b<m_multiBodies.size();b++)
		{
			btMultiBody* bod = m_multiBodies[b];
			bool isSleeping = false;
			if (bod->getBaseCollider() && bod->getBaseCollider()->getActivationState() == ISLAND_SLEEPING)
			{
				isSleeping = true;
			} 
			for (int b=0;b<bod->getNumLinks();b++)
			{
				if (bod->getLink(b).m_collider && bod->getLink(b).m_collider->getActivationState()==ISLAND_SLEEPING)
					isSleeping = true;
			}


			if (!isSleeping)
			{
				int nLinks = bod->getNumLinks();

				///base + num m_links
			
				
				{
					if(!bod->isPosUpdated())
						bod->stepPositionsMultiDof(timeStep);
					else
					{
						btScalar *pRealBuf = const_cast<btScalar *>(bod->getVelocityVector());
						pRealBuf += 6 + bod->getNumDofs() + bod->getNumDofs()*bod->getNumDofs();

						bod->stepPositionsMultiDof(1, 0, pRealBuf);
						bod->setPosUpdated(false);
					}
				}
				
				world_to_local.resize(nLinks+1);
				local_origin.resize(nLinks+1);

				bod->updateCollisionObjectWorldTransforms(world_to_local,local_origin);
				
			} else
			{
				bod->clearVelocities();
			}
		}
	}
}